

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O0

void cpp_wrapper_setup(planck_unit_test_t *tc,Dictionary<int,_int> *dict,
                      ion_behaviour_fill_level_e fill_level)

{
  int local_20;
  int i;
  ion_behaviour_fill_level_e fill_level_local;
  Dictionary<int,_int> *dict_local;
  planck_unit_test_t *tc_local;
  
  switch(fill_level) {
  case ion_fill_none:
    return;
  case ion_fill_edge_cases:
    for (local_20 = -100; local_20 < -0x32; local_20 = local_20 + 2) {
      cpp_wrapper_insert(tc,dict,local_20,local_20 * 3,'\x01');
    }
  case ion_fill_high:
    for (local_20 = 500; local_20 < 1000; local_20 = local_20 + 5) {
      cpp_wrapper_insert(tc,dict,local_20,local_20 * 10,'\x01');
    }
  case ion_fill_medium:
    for (local_20 = 0x32; local_20 < 100; local_20 = local_20 + 2) {
      cpp_wrapper_insert(tc,dict,local_20,local_20 * 5,'\x01');
    }
  case ion_fill_low:
    for (local_20 = 0; local_20 < 10; local_20 = local_20 + 1) {
      cpp_wrapper_insert(tc,dict,local_20,local_20 << 1,'\x01');
    }
    return;
  default:
    return;
  }
}

Assistant:

void
cpp_wrapper_setup(
	planck_unit_test_t *tc,
	Dictionary<int, int>			*dict,
	ion_behaviour_fill_level_e fill_level
) {
	/* This switch statement intentionally doesn't have breaks - we want it to fall through. */
	int i;

	switch (fill_level) {
		case ion_fill_edge_cases: {
			ION_FILL_EDGE_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 3, boolean_true);
			}
		}

		case ion_fill_high: {
			ION_FILL_HIGH_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 10, boolean_true);
			}
		}

		case ion_fill_medium: {
			ION_FILL_MEDIUM_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 5, boolean_true);
			}
		}

		case ion_fill_low: {
			ION_FILL_LOW_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 2, boolean_true);
			}
		}

		case ion_fill_none: {
			/* Intentionally left blank */
		}
	}
}